

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O2

string * __thiscall
cmSourceFile::GetLanguage_abi_cxx11_(string *__return_storage_ptr__,cmSourceFile *this)

{
  char *pcVar1;
  string ext;
  string sStack_38;
  
  pcVar1 = GetProperty(this,&propLANGUAGE_abi_cxx11_);
  if (pcVar1 == (char *)0x0) {
    if ((this->Language)._M_string_length == 0 && (this->FullPath)._M_string_length == 0) {
      if (((this->Location).AmbiguousExtension == true) &&
         ((this->Location).AmbiguousDirectory == true)) {
        GetFullPath(this,(string *)0x0);
      }
      else {
        cmsys::SystemTools::GetFilenameLastExtension(&sStack_38,&(this->Location).Name);
        CheckLanguage(this,&sStack_38);
        std::__cxx11::string::~string((string *)&sStack_38);
      }
    }
    GetLanguage_abi_cxx11_(__return_storage_ptr__,this);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&sStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmSourceFile::GetLanguage()
{
  // If the language was set explicitly by the user then use it.
  if(const char* lang = this->GetProperty(propLANGUAGE))
    {
    return lang;
    }

  // Perform computation needed to get the language if necessary.
  if(this->FullPath.empty() && this->Language.empty())
    {
    // If a known extension is given or a known full path is given
    // then trust that the current extension is sufficient to
    // determine the language.  This will fail only if the user
    // specifies a full path to the source but leaves off the
    // extension, which is kind of weird.
    if(this->Location.ExtensionIsAmbiguous() &&
       this->Location.DirectoryIsAmbiguous())
      {
      // Finalize the file location to get the extension and set the
      // language.
      this->GetFullPath();
      }
    else
      {
      // Use the known extension to get the language if possible.
      std::string ext =
        cmSystemTools::GetFilenameLastExtension(this->Location.GetName());
      this->CheckLanguage(ext);
      }
    }

  // Now try to determine the language.
  return static_cast<cmSourceFile const*>(this)->GetLanguage();
}